

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.h
# Opt level: O2

Int64FeatureType * __thiscall
CoreML::Specification::FeatureType::mutable_int64type(FeatureType *this)

{
  Int64FeatureType *this_00;
  
  if (this->_oneof_case_[0] == 1) {
    this_00 = (this->Type_).int64type_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 1;
    this_00 = (Int64FeatureType *)operator_new(0x18);
    Int64FeatureType::Int64FeatureType(this_00);
    (this->Type_).int64type_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::Int64FeatureType* FeatureType::mutable_int64type() {
  if (!has_int64type()) {
    clear_Type();
    set_has_int64type();
    Type_.int64type_ = new ::CoreML::Specification::Int64FeatureType;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.FeatureType.int64Type)
  return Type_.int64type_;
}